

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hbtrie_test.cc
# Opt level: O1

void large_test(void)

{
  char *__s;
  timeval b;
  timeval b_00;
  timeval b_01;
  timeval b_02;
  timeval b_03;
  timeval b_04;
  timeval b_05;
  timeval b_06;
  timeval b_07;
  timeval b_08;
  timeval b_09;
  timeval a;
  timeval b_10;
  timeval b_11;
  timeval b_12;
  timeval b_13;
  timeval b_14;
  timeval b_15;
  timeval a_00;
  timeval a_01;
  timeval a_02;
  __time_t _Var1;
  __time_t _Var2;
  __time_t _Var3;
  __suseconds_t _Var4;
  __suseconds_t _Var5;
  __suseconds_t _Var6;
  size_t sVar7;
  int iVar8;
  uint32_t uVar9;
  hbtrie_result hVar10;
  void *pvVar11;
  void *pvVar12;
  filemgr_ops *ops;
  filemgr *file;
  btree_blk_ops *btree_blk_ops;
  char *pcVar13;
  bid_t bVar14;
  size_t sVar15;
  void *__dest;
  long lVar16;
  ulong uVar17;
  filemgr_open_result fVar18;
  timeval tVar19;
  timeval tVar20;
  timeval a_03;
  timeval a_04;
  timeval a_05;
  timeval a_06;
  timeval a_07;
  timeval a_08;
  timeval a_09;
  timeval a_10;
  timeval a_11;
  timeval a_12;
  timeval a_13;
  timeval a_14;
  timeval a_15;
  uint64_t _offset;
  filemgr *local_8e0;
  timeval __test_cur;
  size_t keylen;
  docio_object doc;
  timeval __test_begin;
  uint8_t valuebuf [8];
  docio_handle dhandle;
  hbtrie trie;
  btreeblk_handle bhandle;
  char meta [256];
  hbtrie_iterator it;
  char body [256];
  filemgr_config config;
  char dockey [256];
  char keybuf [256];
  char bodybuf [256];
  char metabuf [256];
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  __test_cur.tv_sec = __test_begin.tv_sec;
  __test_cur.tv_usec = __test_begin.tv_usec;
  doc.length.keylen = 0;
  doc.length.metalen = 0;
  doc.length.bodylen = 0;
  doc.length.bodylen_ondisk = 0;
  doc.length.flag = '\0';
  doc.length.checksum = '\0';
  doc.length.reserved = 0;
  doc.timestamp = 0;
  doc.key = (void *)0x0;
  doc.field_3.seqnum = 0;
  doc.meta = (void *)0x0;
  doc.body = (void *)0x0;
  keylen = 8;
  pvVar11 = malloc(800000);
  pvVar12 = malloc(800000);
  doc.key = keybuf;
  doc.meta = metabuf;
  doc.body = bodybuf;
  config.prefetch_duration = 0;
  config.encryption_key.bytes[0] = '\0';
  config.encryption_key.bytes[1] = '\0';
  config.encryption_key.bytes[2] = '\0';
  config.encryption_key.bytes[3] = '\0';
  config.encryption_key.bytes[4] = '\0';
  config.encryption_key.bytes[5] = '\0';
  config.encryption_key.bytes[6] = '\0';
  config.encryption_key.bytes[7] = '\0';
  config.encryption_key.bytes[8] = '\0';
  config.encryption_key.bytes[9] = '\0';
  config.encryption_key.bytes[10] = '\0';
  config.encryption_key.bytes[0xb] = '\0';
  config.encryption_key.bytes[0xc] = '\0';
  config.encryption_key.bytes[0xd] = '\0';
  config.encryption_key.bytes[0xe] = '\0';
  config.encryption_key.bytes[0xf] = '\0';
  config.encryption_key.bytes[0x10] = '\0';
  config.encryption_key.bytes[0x11] = '\0';
  config.encryption_key.bytes[0x12] = '\0';
  config.encryption_key.bytes[0x13] = '\0';
  config.encryption_key.bytes[0x14] = '\0';
  config.encryption_key.bytes[0x15] = '\0';
  config.encryption_key.bytes[0x16] = '\0';
  config.encryption_key.bytes[0x17] = '\0';
  config.encryption_key.bytes[0x18] = '\0';
  config.encryption_key.bytes[0x19] = '\0';
  config.encryption_key.bytes[0x1a] = '\0';
  config.encryption_key.bytes[0x1b] = '\0';
  config.encryption_key.bytes[0x1c] = '\0';
  config.encryption_key.bytes[0x1d] = '\0';
  config.encryption_key.bytes[0x1e] = '\0';
  config.encryption_key.bytes[0x1f] = '\0';
  config.block_reusing_threshold.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)0;
  config.num_keeping_headers.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)0;
  config.do_not_cache_doc_blocks = false;
  config._89_3_ = 0;
  config.num_blocks_readahead = 0;
  config.blocksize = 0x1000;
  config.ncacheblock = 0;
  config.flag = 0;
  config.chunksize = 8;
  config.options = '\b';
  config.seqtree_opt = '\0';
  config._18_6_ = 0;
  config.num_wal_shards = 8;
  config.num_bcache_shards = 0;
  config.encryption_key.algorithm = 0;
  puts("filemgr, bcache init .. ");
  system("rm -rf  hbtrie_testfile");
  ops = get_filemgr_ops();
  fVar18 = filemgr_open("./hbtrie_testfile",ops,&config,(err_log_callback *)0x0);
  file = fVar18.file;
  docio_init(&dhandle,file,false);
  local_8e0 = file;
  btreeblk_init(&bhandle,file,0x1000);
  btree_blk_ops = btreeblk_get_ops();
  hbtrie_init(&trie,8,8,0x1000,0xffffffffffffffff,&bhandle,btree_blk_ops,&dhandle,_readkey_wrap);
  tVar20.tv_usec = __test_cur.tv_usec;
  tVar20.tv_sec = __test_cur.tv_sec;
  gettimeofday((timeval *)&__test_cur,(__timezone_ptr_t)0x0);
  _Var6 = __test_begin.tv_usec;
  _Var3 = __test_begin.tv_sec;
  _Var4 = __test_cur.tv_usec;
  _Var1 = __test_cur.tv_sec;
  a_00.tv_usec = __test_begin.tv_usec;
  a_00.tv_sec = __test_begin.tv_sec;
  b.tv_usec = __test_cur.tv_usec;
  b.tv_sec = __test_cur.tv_sec;
  tVar19.tv_usec = __test_cur.tv_usec;
  tVar19.tv_sec = __test_cur.tv_sec;
  tVar19 = _utime_gap(a_00,tVar19);
  tVar20 = _utime_gap(tVar20,b);
  printf("Time elapsed: total %ld.%06ld , interval %ld.%06ld\n",tVar19.tv_sec,tVar19.tv_usec,
         tVar20.tv_sec,tVar20.tv_usec);
  puts("doc append .. ");
  uVar17 = 0;
  do {
    sVar7 = keylen;
    pcVar13 = (char *)malloc(keylen + 1);
    *(char **)((long)pvVar11 + uVar17 * 8) = pcVar13;
    lVar16 = (long)(int)sVar7;
    pcVar13[lVar16] = '\0';
    do {
      iVar8 = rand();
      pcVar13[lVar16 + -1] =
           (char)iVar8 +
           ((char)(uint)((ulong)((long)iVar8 * 0x2c0b02c1) >> 0x24) - (char)(iVar8 >> 0x1f)) * -0x5d
           + '!';
      lVar16 = lVar16 + -1;
    } while (lVar16 != 0);
    strcpy(dockey,pcVar13);
    meta[0] = 'm';
    meta[1] = '\0';
    sprintf(body,"body_%3d",uVar17 & 0xffffffff);
    pcVar13 = dockey;
    uVar9 = _set_doc(&doc,dockey,meta,body);
    if (uVar9 == 0) {
      large_test();
      goto LAB_0010696e;
    }
    bVar14 = docio_append_doc(&dhandle,&doc,'\0','\0');
    *(bid_t *)((long)pvVar12 + uVar17 * 8) = bVar14;
    uVar17 = uVar17 + 1;
  } while (uVar17 != 100000);
  lVar16 = 0;
  gettimeofday((timeval *)&__test_cur,(__timezone_ptr_t)0x0);
  _Var5 = __test_cur.tv_usec;
  _Var2 = __test_cur.tv_sec;
  b_01.tv_usec = __test_cur.tv_usec;
  b_01.tv_sec = __test_cur.tv_sec;
  b_00.tv_usec = __test_cur.tv_usec;
  b_00.tv_sec = __test_cur.tv_sec;
  a_03.tv_usec = _Var6;
  a_03.tv_sec = _Var3;
  tVar20 = _utime_gap(a_03,b_00);
  a_04.tv_usec = _Var4;
  a_04.tv_sec = _Var1;
  tVar19 = _utime_gap(a_04,b_01);
  printf("Time elapsed: total %ld.%06ld , interval %ld.%06ld\n",tVar20.tv_sec,tVar20.tv_usec,
         tVar19.tv_sec,tVar19.tv_usec);
  puts("hbtrie update .. ");
  do {
    pcVar13 = *(char **)((long)pvVar11 + lVar16);
    sVar15 = strlen(pcVar13);
    hbtrie_insert(&trie,pcVar13,(int)sVar15,(void *)((long)pvVar12 + lVar16),&_offset);
    btreeblk_end(&bhandle);
    lVar16 = lVar16 + 8;
  } while (lVar16 != 800000);
  gettimeofday((timeval *)&__test_cur,(__timezone_ptr_t)0x0);
  b_03.tv_usec = __test_cur.tv_usec;
  b_03.tv_sec = __test_cur.tv_sec;
  b_02.tv_usec = __test_cur.tv_usec;
  b_02.tv_sec = __test_cur.tv_sec;
  a_05.tv_usec = _Var6;
  a_05.tv_sec = _Var3;
  tVar20 = _utime_gap(a_05,b_02);
  a_06.tv_usec = _Var5;
  a_06.tv_sec = _Var2;
  tVar19 = _utime_gap(a_06,b_03);
  printf("Time elapsed: total %ld.%06ld , interval %ld.%06ld\n",tVar20.tv_sec,tVar20.tv_usec,
         tVar19.tv_sec,tVar19.tv_usec);
  puts("filemgr commit .. ");
  filemgr_commit(local_8e0,true,(err_log_callback *)0x0);
  _Var4 = __test_cur.tv_usec;
  _Var1 = __test_cur.tv_sec;
  gettimeofday((timeval *)&__test_cur,(__timezone_ptr_t)0x0);
  _Var5 = __test_begin.tv_usec;
  _Var2 = __test_begin.tv_sec;
  _Var6 = __test_cur.tv_usec;
  _Var3 = __test_cur.tv_sec;
  a_01.tv_usec = __test_begin.tv_usec;
  a_01.tv_sec = __test_begin.tv_sec;
  b_05.tv_usec = __test_cur.tv_usec;
  b_05.tv_sec = __test_cur.tv_sec;
  b_04.tv_usec = __test_cur.tv_usec;
  b_04.tv_sec = __test_cur.tv_sec;
  tVar20 = _utime_gap(a_01,b_04);
  a_07.tv_usec = _Var4;
  a_07.tv_sec = _Var1;
  tVar19 = _utime_gap(a_07,b_05);
  printf("Time elapsed: total %ld.%06ld , interval %ld.%06ld\n",tVar20.tv_sec,tVar20.tv_usec,
         tVar19.tv_sec,tVar19.tv_usec);
  puts("doc append .. ");
  uVar17 = 0;
  do {
    strcpy(dockey,*(char **)((long)pvVar11 + uVar17 * 8));
    meta[0] = 'm';
    meta[1] = 'e';
    meta[2] = '\0';
    sprintf(body,"body2_%3d",uVar17 & 0xffffffff);
    pcVar13 = dockey;
    uVar9 = _set_doc(&doc,dockey,meta,body);
    if (uVar9 == 0) goto LAB_0010696e;
    bVar14 = docio_append_doc(&dhandle,&doc,'\0','\0');
    *(bid_t *)((long)pvVar12 + uVar17 * 8) = bVar14;
    uVar17 = uVar17 + 1;
  } while (uVar17 != 100000);
  lVar16 = 0;
  gettimeofday((timeval *)&__test_cur,(__timezone_ptr_t)0x0);
  _Var4 = __test_cur.tv_usec;
  _Var1 = __test_cur.tv_sec;
  b_07.tv_usec = __test_cur.tv_usec;
  b_07.tv_sec = __test_cur.tv_sec;
  b_06.tv_usec = __test_cur.tv_usec;
  b_06.tv_sec = __test_cur.tv_sec;
  a_08.tv_usec = _Var5;
  a_08.tv_sec = _Var2;
  tVar20 = _utime_gap(a_08,b_06);
  a_09.tv_usec = _Var6;
  a_09.tv_sec = _Var3;
  tVar19 = _utime_gap(a_09,b_07);
  printf("Time elapsed: total %ld.%06ld , interval %ld.%06ld\n",tVar20.tv_sec,tVar20.tv_usec,
         tVar19.tv_sec,tVar19.tv_usec);
  puts("hbtrie update .. ");
  do {
    pcVar13 = *(char **)((long)pvVar11 + lVar16);
    sVar15 = strlen(pcVar13);
    hbtrie_insert(&trie,pcVar13,(int)sVar15,(void *)((long)pvVar12 + lVar16),&_offset);
    btreeblk_end(&bhandle);
    lVar16 = lVar16 + 8;
  } while (lVar16 != 800000);
  gettimeofday((timeval *)&__test_cur,(__timezone_ptr_t)0x0);
  b_09.tv_usec = __test_cur.tv_usec;
  b_09.tv_sec = __test_cur.tv_sec;
  b_08.tv_usec = __test_cur.tv_usec;
  b_08.tv_sec = __test_cur.tv_sec;
  a_10.tv_usec = _Var5;
  a_10.tv_sec = _Var2;
  tVar20 = _utime_gap(a_10,b_08);
  a_11.tv_usec = _Var4;
  a_11.tv_sec = _Var1;
  tVar19 = _utime_gap(a_11,b_09);
  printf("Time elapsed: total %ld.%06ld , interval %ld.%06ld\n",tVar20.tv_sec,tVar20.tv_usec,
         tVar19.tv_sec,tVar19.tv_usec);
  puts("filemgr commit .. ");
  filemgr_commit(local_8e0,true,(err_log_callback *)0x0);
  a.tv_usec = __test_cur.tv_usec;
  a.tv_sec = __test_cur.tv_sec;
  gettimeofday((timeval *)&__test_cur,(__timezone_ptr_t)0x0);
  _Var4 = __test_cur.tv_usec;
  _Var1 = __test_cur.tv_sec;
  a_02.tv_usec = __test_begin.tv_usec;
  a_02.tv_sec = __test_begin.tv_sec;
  b_11.tv_usec = __test_cur.tv_usec;
  b_11.tv_sec = __test_cur.tv_sec;
  b_10.tv_usec = __test_cur.tv_usec;
  b_10.tv_sec = __test_cur.tv_sec;
  tVar20 = _utime_gap(a_02,b_10);
  tVar19 = _utime_gap(a,b_11);
  printf("Time elapsed: total %ld.%06ld , interval %ld.%06ld\n",tVar20.tv_sec,tVar20.tv_usec,
         tVar19.tv_sec,tVar19.tv_usec);
  puts("hbtrie search .. ");
  uVar17 = 0;
  do {
    __s = *(char **)((long)pvVar11 + uVar17 * 8);
    sVar15 = strlen(__s);
    pcVar13 = __s;
    hVar10 = hbtrie_find(&trie,__s,(int)sVar15,valuebuf);
    btreeblk_end(&bhandle);
    if (hVar10 == HBTRIE_RESULT_FAIL) goto LAB_00106973;
    _offset._0_1_ = valuebuf[0];
    _offset._1_1_ = valuebuf[1];
    _offset._2_1_ = valuebuf[2];
    _offset._3_1_ = valuebuf[3];
    _offset._4_1_ = valuebuf[4];
    _offset._5_1_ = valuebuf[5];
    _offset._6_1_ = valuebuf[6];
    _offset._7_1_ = valuebuf[7];
    docio_read_doc(&dhandle,(uint64_t)valuebuf,&doc,true);
    meta[0] = 'm';
    meta[1] = 'e';
    meta[2] = '\0';
    sprintf(body,"body2_%3d",uVar17 & 0xffffffff);
    iVar8 = bcmp(doc.key,__s,doc.length._0_8_ & 0xffff);
    if (iVar8 != 0) {
      large_test();
    }
    iVar8 = bcmp(doc.meta,meta,(ulong)doc.length._0_8_ >> 0x10 & 0xffff);
    if (iVar8 != 0) {
      large_test();
    }
    iVar8 = bcmp(doc.body,body,(ulong)doc.length._0_8_ >> 0x20);
    if (iVar8 != 0) {
      large_test();
    }
    uVar17 = uVar17 + 1;
  } while (uVar17 != 100000);
  gettimeofday((timeval *)&__test_cur,(__timezone_ptr_t)0x0);
  _Var6 = __test_cur.tv_usec;
  _Var3 = __test_cur.tv_sec;
  b_13.tv_usec = __test_cur.tv_usec;
  b_13.tv_sec = __test_cur.tv_sec;
  b_12.tv_usec = __test_cur.tv_usec;
  b_12.tv_sec = __test_cur.tv_sec;
  a_12.tv_usec = __test_begin.tv_usec;
  a_12.tv_sec = __test_begin.tv_sec;
  tVar20 = _utime_gap(a_12,b_12);
  a_13.tv_usec = _Var4;
  a_13.tv_sec = _Var1;
  tVar19 = _utime_gap(a_13,b_13);
  printf("Time elapsed: total %ld.%06ld , interval %ld.%06ld\n",tVar20.tv_sec,tVar20.tv_usec,
         tVar19.tv_sec,tVar19.tv_usec);
  puts("hbtrie iterator ..");
  hbtrie_iterator_init(&trie,&it,(void *)0x0,0);
  iVar8 = 100000;
  while( true ) {
    pcVar13 = keybuf;
    hVar10 = hbtrie_next(&it,pcVar13,&keylen,&_offset);
    if (hVar10 == HBTRIE_RESULT_FAIL) break;
    btreeblk_end(&bhandle);
    docio_read_doc(&dhandle,_offset,&doc,true);
    iVar8 = iVar8 + -1;
    if (iVar8 == 0) {
      hbtrie_iterator_free(&it);
      gettimeofday((timeval *)&__test_cur,(__timezone_ptr_t)0x0);
      b_15.tv_usec = __test_cur.tv_usec;
      b_15.tv_sec = __test_cur.tv_sec;
      b_14.tv_usec = __test_cur.tv_usec;
      b_14.tv_sec = __test_cur.tv_sec;
      a_14.tv_usec = __test_begin.tv_usec;
      a_14.tv_sec = __test_begin.tv_sec;
      tVar20 = _utime_gap(a_14,b_14);
      a_15.tv_usec = _Var6;
      a_15.tv_sec = _Var3;
      tVar19 = _utime_gap(a_15,b_15);
      printf("Time elapsed: total %ld.%06ld , interval %ld.%06ld\n",tVar20.tv_sec,tVar20.tv_usec,
             tVar19.tv_sec,tVar19.tv_usec);
      printf("trie root bid %lu\n",trie.root_bid);
      filemgr_close(local_8e0,true,(char *)0x0,(err_log_callback *)0x0);
      filemgr_shutdown();
      pcVar13 = "%s PASSED\n";
      if (large_test()::__test_pass != '\0') {
        pcVar13 = "%s FAILED\n";
      }
      fprintf(_stderr,pcVar13,"large test");
      return;
    }
  }
LAB_00106978:
  large_test();
  pcVar13 = _skew_key_ptr
            [(ulong)pcVar13 >> 0x38 | ((ulong)pcVar13 & 0xff000000000000) >> 0x28 |
             ((ulong)pcVar13 & 0xff0000000000) >> 0x18 | ((ulong)pcVar13 & 0xff00000000) >> 8 |
             ((ulong)pcVar13 & 0xff000000) << 8 | ((ulong)pcVar13 & 0xff0000) << 0x18 |
             ((ulong)pcVar13 & 0xff00) << 0x28 | (long)pcVar13 << 0x38];
  sVar15 = strlen(pcVar13);
  memcpy(__dest,pcVar13,sVar15 & 0xffff);
  return;
LAB_0010696e:
  large_test();
LAB_00106973:
  large_test();
  goto LAB_00106978;
}

Assistant:

void large_test()
{
    TEST_INIT();

    int blocksize = 4096 * 1;
    struct btreeblk_handle bhandle;
    struct docio_handle dhandle;
    struct filemgr *file;
    struct hbtrie trie;
    struct docio_object doc;
    struct filemgr_config config;
    uint32_t docsize;
    char keybuf[256], metabuf[256], bodybuf[256];
    char dockey[256], meta[256], body[256];
    uint8_t valuebuf[8];
    hbtrie_result r;

    int i, k, n=100000, m=1, rr;
    size_t keylen = 8;
    char **key;
    uint64_t *offset;
    uint64_t _offset;

    key = (char **)malloc(sizeof(char*) * n);
    offset = (uint64_t *)malloc(sizeof(uint64_t) * n);

    doc.key = (void*)keybuf;
    doc.meta = (void*)metabuf;
    doc.body = (void*)bodybuf;

    memset(&config, 0, sizeof(config));
    config.blocksize = blocksize;
    config.ncacheblock = 0 * 1024 * 128;
    config.flag = 0;
    config.options = FILEMGR_CREATE;
    config.chunksize = sizeof(uint64_t);
    config.num_wal_shards = 8;

    DBG("filemgr, bcache init .. \n");
    rr = system(SHELL_DEL" hbtrie_testfile");
    (void)rr;
    filemgr_open_result result = filemgr_open((char *) "./hbtrie_testfile",
                                              get_filemgr_ops(), &config, NULL);
    file = result.file;
    docio_init(&dhandle, file, false);
    btreeblk_init(&bhandle, file, blocksize);

    hbtrie_init(&trie, 8, 8, blocksize, BLK_NOT_FOUND,
        (void*)&bhandle, btreeblk_get_ops(), (void*)&dhandle, _readkey_wrap);
    TEST_TIME();

    for (k=0;k<m;++k) {
        DBG("doc append .. \n");
        for (i=(n/m)*k;i<(n/m)*(k+1);++i){
            key[i] = (char *)malloc(keylen+1);
            _set_random_key(key[i], keylen);

            //DBG("%s\n", key[i]);
            sprintf(dockey, "%s", key[i]);
            sprintf(meta, "m");
            sprintf(body, "body_%3d", i);
            docsize = _set_doc(&doc, dockey, meta, body);
            TEST_CHK(docsize != 0);
            offset[i] = docio_append_doc(&dhandle, &doc, 0, 0);
        }
        TEST_TIME();

        DBG("hbtrie update .. \n");
        for (i=(n/m)*k;i<(n/m)*(k+1);++i){
            hbtrie_insert(&trie, (void*)key[i], strlen(key[i]),
                          (void*)&offset[i], (void*)&_offset);
            btreeblk_end(&bhandle);
        }
        TEST_TIME();

        DBG("filemgr commit .. \n");
        filemgr_commit(file, true, NULL);
        TEST_TIME();
    }

    for (k=0;k<m;++k) {
        DBG("doc append .. \n");
        for (i=(n/m)*k;i<(n/m)*(k+1);++i){
            sprintf(dockey, "%s", key[i]);
            sprintf(meta, "me");
            sprintf(body, "body2_%3d", i);
            docsize = _set_doc(&doc, dockey, meta, body);
            TEST_CHK(docsize != 0);
            offset[i] = docio_append_doc(&dhandle, &doc, 0, 0);
        }
        TEST_TIME();

        DBG("hbtrie update .. \n");
        for (i=(n/m)*k;i<(n/m)*(k+1);++i){
            hbtrie_insert(&trie, (void*)key[i], strlen(key[i]),
                          (void*)&offset[i], (void*)&_offset);
            btreeblk_end(&bhandle);
        }
        TEST_TIME();

        DBG("filemgr commit .. \n");
        filemgr_commit(file, true, NULL);
        TEST_TIME();
    }

    DBG("hbtrie search .. \n");
    for (i=0;i<n;++i) {
        //DBG("key %s\n", key[i]);
        r = hbtrie_find(&trie, (void*)key[i], strlen(key[i]), (void*)valuebuf);
        btreeblk_end(&bhandle);
        TEST_CHK(r != HBTRIE_RESULT_FAIL);

        if (r != HBTRIE_RESULT_FAIL) {
            memcpy(&_offset, valuebuf, 8);
            docio_read_doc(&dhandle, _offset, &doc, true);

            sprintf(meta, "me");
            sprintf(body, "body2_%3d", i);
            TEST_CHK(!memcmp(doc.key, key[i], doc.length.keylen));
            TEST_CHK(!memcmp(doc.meta, meta, doc.length.metalen));
            TEST_CHK(!memcmp(doc.body, body, doc.length.bodylen));

        }
    }
    TEST_TIME();

    DBG("hbtrie iterator ..\n");
    struct hbtrie_iterator it;
    hbtrie_iterator_init(&trie, &it, NULL, 0);
    for (i=0;i<n;++i){
        r = hbtrie_next(&it, (void*)keybuf, &keylen, (void*)&_offset);
        TEST_CHK(r != HBTRIE_RESULT_FAIL);
        btreeblk_end(&bhandle);
        docio_read_doc(&dhandle, _offset, &doc, true);
        /*
        keybuf[keylen] = 0;
        DBG("%s\n", keybuf);*/
    }
    hbtrie_iterator_free(&it);


    TEST_TIME();

    DBG("trie root bid %" _F64 "\n", trie.root_bid);

    filemgr_close(file, true, NULL, NULL);
    filemgr_shutdown();

    TEST_RESULT("large test");
}